

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O3

void __thiscall vw::learn(vw *this,multi_ex *ec)

{
  bool bVar1;
  multi_learner *pmVar2;
  vw_exception *this_00;
  stringstream __msg;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  if (this->l[0xe8] != (learner<char,_char>)0x0) {
    bVar1 = this->training;
    pmVar2 = LEARNER::as_multiline<char,char>(this->l);
    (**(code **)(pmVar2 + (ulong)(bVar1 ^ 1) * 8 + 0x28))
              (*(undefined8 *)(pmVar2 + 0x18),*(undefined8 *)(pmVar2 + 0x20),ec,
               *(code **)(pmVar2 + (ulong)(bVar1 ^ 1) * 8 + 0x28));
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (&local_190,"This reduction does not support multi-line example.",0x33);
  this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/global_data.cc"
             ,0x9b,&local_1c0);
  __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void vw::learn(multi_ex& ec)
{
  if (!l->is_multiline)
    THROW("This reduction does not support multi-line example.");

  if (!training)
    LEARNER::as_multiline(l)->predict(ec);
  else
    LEARNER::as_multiline(l)->learn(ec);
}